

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O1

int cuddIsInDeathRow(DdManager *dd,DdNode *f)

{
  long lVar1;
  
  if (0 < (long)dd->deathRowDepth) {
    lVar1 = 0;
    do {
      if (dd->deathRow[lVar1] == f) {
        return (int)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (dd->deathRowDepth != lVar1);
  }
  return -1;
}

Assistant:

int
cuddIsInDeathRow(
  DdManager *dd,
  DdNode *f)
{
#ifndef DD_NO_DEATH_ROW
    int i;

    for (i = 0; i < dd->deathRowDepth; i++) {
        if (f == dd->deathRow[i]) {
            return(i);
        }
    }
#endif

    return(-1);

}